

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void decode_ustr(Symbol *sym,double *pg1,double *pg2,char *s)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  
  uVar2 = sym->subtype;
  switch((ulong)((uint)uVar2 & 0x1e) - 2 >> 1) {
  case 0:
    if ((sym->u).str == (char *)0x0) {
      __assert_fail("sym && sym->u.str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x72f,"void decode_ustr()");
    }
    pcVar6 = "[%*d]\n%lf\n%s";
    if ((uVar2 & 0x20) == 0) {
      pcVar6 = "%lf\n%s";
    }
    iVar3 = __isoc99_sscanf((sym->u).str,pcVar6,pg1,s);
    if (iVar3 == 1) goto LAB_00108796;
    if (iVar3 != 2) {
      __assert_fail("i == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x739,"void decode_ustr()");
    }
    break;
  case 1:
  case 3:
  case 7:
    if ((sym->u).str == (char *)0x0) {
      __assert_fail("sym && sym->u.str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x71c,"void decode_ustr()");
    }
    pcVar6 = "[%*d]\n%lf%*c%lf";
    if ((uVar2 & 0x20) == 0) {
      pcVar6 = "%lf%*c%lf";
    }
    uVar5 = 0;
    iVar3 = __isoc99_sscanf((sym->u).str,pcVar6,pg1);
    if (iVar3 != 2) {
      __assert_fail("i == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x722,"void decode_ustr()");
    }
    pcVar6 = (sym->u).str;
    for (; uVar5 < 2; uVar5 = uVar5 + (cVar1 == '\n')) {
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    }
    for (lVar4 = 0; pcVar6[lVar4] != '\n'; lVar4 = lVar4 + 1) {
      s[lVar4] = pcVar6[lVar4];
    }
    s[lVar4] = '\0';
    break;
  default:
    diag(sym->name," does not have a proper declaration");
  }
  if (*s != '0') {
    return;
  }
LAB_00108796:
  *s = '\0';
  return;
}

Assistant:

void decode_ustr(sym, pg1, pg2, s)	/* decode sym->u.str */
	Symbol *sym;
	char *s;
	double *pg1, *pg2;
{
	int i, n;
	char *cp, *cp1;
	
	switch (sym->subtype & (INDEP | DEP | STAT | PARM)) {

	case INDEP:	/* but doesnt get all info */
	case DEP:
	case STAT:
		assert(sym && sym->u.str);
		if (sym->subtype & ARRAY) { /* see parsact.c */
			i = sscanf(sym->u.str, "[%*d]\n%lf%*c%lf", pg1, pg2);
		}else{			
			i = sscanf(sym->u.str, "%lf%*c%lf", pg1, pg2);
		}
		assert(i == 2);
		for (n=0, cp = sym->u.str; n < 2;) {
			if (*cp++ == '\n') {
				n++;
			}
		}
		for (cp1 = s; *cp != '\n';) {
			*cp1++ = *cp++;
		}
		*cp1 = '\0';
		break;

	case PARM:
		assert(sym && sym->u.str);
		if (sym->subtype & ARRAY) { /* see parsact.c */
			i = sscanf(sym->u.str, "[%*d]\n%lf\n%s", pg1, s);
		}else{			
			i = sscanf(sym->u.str, "%lf\n%s", pg1, s);
		}
		if (i == 1) {
			s[0] = '\0';
			i = 2;
		}
		assert(i == 2);
		break;
	default:
		diag(sym->name, " does not have a proper declaration");
	}
	if (s[0] == '0') {s[0] = '\0';}
}